

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O2

void webfront::log::info<>(string_view fmt)

{
  double in_XMM0_Qa;
  
  if (logTypeEnabled._3_1_ == '\x01') {
    anon_unknown_4::log(in_XMM0_Qa);
    return;
  }
  return;
}

Assistant:

void info(string_view fmt, Ts&&... ts) { if (is(Info)) log(Info, fmt, std::forward<Ts>(ts)...); }